

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

StkId tryfuncTM(lua_State *L,StkId func)

{
  long lVar1;
  TValue *pTVar2;
  TValue *io1;
  StkId pSVar3;
  TValue *io1_1;
  
  if ((long)(L->stack_last).p - (L->top).offset < 0x11) {
    lVar1 = (L->stack).offset;
    if (0 < L->l_G->GCdebt) {
      luaC_step(L);
    }
    luaD_growstack(L,1,1);
    func = (StkId)(((long)func - lVar1) + (long)(L->stack).p);
  }
  pTVar2 = luaT_gettmbyobj(L,&func->val,TM_CALL);
  if ((pTVar2->tt_ & 0xf) != 0) {
    for (pSVar3 = (L->top).p; func < pSVar3; pSVar3 = pSVar3 + -1) {
      (pSVar3->val).value_ = pSVar3[-1].val.value_;
      (pSVar3->val).tt_ = *(lu_byte *)((long)pSVar3 + -8);
    }
    (L->top).p = (StkId)((L->top).offset + 0x10);
    (func->val).value_ = pTVar2->value_;
    (func->val).tt_ = pTVar2->tt_;
    return func;
  }
  luaG_callerror(L,&func->val);
}

Assistant:

static StkId tryfuncTM (lua_State *L, StkId func) {
  const TValue *tm;
  StkId p;
  checkstackGCp(L, 1, func);  /* space for metamethod */
  tm = luaT_gettmbyobj(L, s2v(func), TM_CALL);  /* (after previous GC) */
  if (l_unlikely(ttisnil(tm)))
    luaG_callerror(L, s2v(func));  /* nothing to call */
  for (p = L->top.p; p > func; p--)  /* open space for metamethod */
    setobjs2s(L, p, p-1);
  L->top.p++;  /* stack space pre-allocated by the caller */
  setobj2s(L, func, tm);  /* metamethod is the new function to be called */
  return func;
}